

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTestsNamesOnly(Config *config)

{
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar5;
  undefined4 extraout_var_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar6;
  pointer pTVar7;
  size_t sVar8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  char local_49;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_48;
  
  iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  pSVar5 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar4 = (*(pSVar5->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar5);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x18))
                        ((long *)CONCAT44(extraout_var_00,iVar4),config);
  filterTests(&local_48,testCases,(TestSpec *)CONCAT44(extraout_var,iVar3),&config->super_IConfig);
  sVar8 = 0;
  if (local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar7 = local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pTVar7->super_TestCaseInfo).name._M_dataplus._M_p;
      sVar2 = (pTVar7->super_TestCaseInfo).name._M_string_length;
      if ((sVar2 == 0) || (*pcVar1 != '#')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
      }
      else {
        local_49 = '\"';
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_49,1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pTVar7->super_TestCaseInfo).name._M_dataplus._M_p,
                            (pTVar7->super_TestCaseInfo).name._M_string_length);
        local_49 = '\"';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
      }
      iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])(config);
      if (1 < iVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t@",2);
        operator<<((ostream *)&std::cout,&(pTVar7->super_TestCaseInfo).lineInfo);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      pTVar7 = pTVar7 + 1;
      sVar8 = sVar8 + 1;
    } while (pTVar7 != local_48.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_48);
  return sVar8;
}

Assistant:

std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            matchedTests++;
            if( startsWith( testCaseInfo.name, '#' ) )
               Catch::cout() << '"' << testCaseInfo.name << '"';
            else
               Catch::cout() << testCaseInfo.name;
            if ( config.verbosity() >= Verbosity::High )
                Catch::cout() << "\t@" << testCaseInfo.lineInfo;
            Catch::cout() << std::endl;
        }
        return matchedTests;
    }